

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

void Vec_IntPush(Vec_Int_t *p,int Entry)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  
  uVar1 = p->nSize;
  if (uVar1 == p->nCap) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(0x40);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,0x40);
      }
      p->pArray = piVar3;
      if (piVar3 == (int *)0x0) {
LAB_0090b3d9:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      p->nCap = 0x10;
    }
    else {
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc((ulong)uVar1 * 8);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,(ulong)uVar1 * 8);
      }
      p->pArray = piVar3;
      if (piVar3 == (int *)0x0) goto LAB_0090b3d9;
      p->nCap = uVar1 * 2;
    }
  }
  else {
    piVar3 = p->pArray;
  }
  iVar2 = p->nSize;
  p->nSize = iVar2 + 1;
  piVar3[iVar2] = Entry;
  return;
}

Assistant:

static inline void Vec_IntPush( Vec_Int_t * p, int Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_IntGrow( p, 16 );
        else
            Vec_IntGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}